

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::udp_tracker_connection::update_transaction_id(udp_tracker_connection *this)

{
  tracker_manager *this_00;
  long lVar1;
  undefined1 local_28 [28];
  uint32_t new_tid;
  udp_tracker_connection *this_local;
  
  unique0x10000091 = this;
  lVar1 = random((aux *)0xfffffffe);
  local_28._20_4_ = (int)lVar1 + 1;
  if (this->m_transaction_id != 0) {
    this_00 = (this->super_tracker_connection).m_man;
    shared_from_this((udp_tracker_connection *)local_28);
    tracker_manager::update_transaction_id
              (this_00,(shared_ptr<libtorrent::aux::udp_tracker_connection> *)local_28,
               local_28._20_4_);
    ::std::shared_ptr<libtorrent::aux::udp_tracker_connection>::~shared_ptr
              ((shared_ptr<libtorrent::aux::udp_tracker_connection> *)local_28);
  }
  this->m_transaction_id = local_28._20_4_;
  return;
}

Assistant:

void udp_tracker_connection::update_transaction_id()
	{
		// don't use 0, because that has special meaning (uninitialized)
		std::uint32_t const new_tid = random(0xfffffffe) + 1;

		if (m_transaction_id != 0)
			m_man.update_transaction_id(shared_from_this(), new_tid);
		m_transaction_id = new_tid;
	}